

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,LocalSocketState state)

{
  long *plVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  QDebug *pQVar2;
  storage_type *psVar3;
  Stream *pSVar4;
  QTextStream *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  pQVar2 = (QDebug *)CONCAT44(in_register_00000034,state);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,pQVar2);
  plVar1 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar1 + 0x30) = 0;
  pQVar5 = (QTextStream *)pQVar2->stream;
  switch(in_EDX) {
  case 0:
    psVar3 = (storage_type *)0x1e;
    break;
  default:
    QVar7.m_data = (storage_type *)0x1a;
    QVar7.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar5,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar5 = (QTextStream *)pQVar2->stream;
    if (pQVar5[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar5,' ');
      pQVar5 = (QTextStream *)pQVar2->stream;
    }
    QTextStream::operator<<(pQVar5,in_EDX);
    pQVar5 = (QTextStream *)pQVar2->stream;
    if (pQVar5[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar5,' ');
      pQVar5 = (QTextStream *)pQVar2->stream;
    }
    QTextStream::operator<<(pQVar5,')');
    pSVar4 = pQVar2->stream;
    if (pSVar4[0x30] != (Stream)0x1) goto LAB_002408e2;
    goto LAB_002408d8;
  case 2:
    psVar3 = (storage_type *)0x1d;
    break;
  case 3:
    psVar3 = (storage_type *)0x1c;
    break;
  case 6:
    psVar3 = (storage_type *)0x1a;
  }
  QVar6.m_data = psVar3;
  QVar6.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar5,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  pSVar4 = pQVar2->stream;
  if (pSVar4[0x30] != (Stream)0x0) {
LAB_002408d8:
    QTextStream::operator<<((QTextStream *)pSVar4,' ');
  }
LAB_002408e2:
  pSVar4 = pQVar2->stream;
  pQVar2->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QLocalSocket::LocalSocketState state)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    switch (state) {
    case QLocalSocket::UnconnectedState:
        debug << "QLocalSocket::UnconnectedState";
        break;
    case QLocalSocket::ConnectingState:
        debug << "QLocalSocket::ConnectingState";
        break;
    case QLocalSocket::ConnectedState:
        debug << "QLocalSocket::ConnectedState";
        break;
    case QLocalSocket::ClosingState:
        debug << "QLocalSocket::ClosingState";
        break;
    default:
        debug << "QLocalSocket::SocketState(" << int(state) << ')';
        break;
    }
    return debug;
}